

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O2

int __thiscall
jrtplib::RTPTCPTransmitter::PollSocket(RTPTCPTransmitter *this,SocketType sock,SocketData *sdata)

{
  uint8_t *puVar1;
  int iVar2;
  RTPAddress *pRVar3;
  RTCPCommonHeader *rtcpheader;
  bool bVar4;
  bool complete;
  size_t len;
  RTPTCPTransmitter *local_68;
  _func_int **local_60;
  list<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_> *local_58;
  int *local_50;
  size_t local_48;
  double local_40;
  RTPRawPacket *pPack;
  
  local_50 = &sdata->m_lengthBufferOffset;
  local_58 = &this->m_rawpacketlist;
  local_60 = (_func_int **)&PTR_CreateCopy_00145cf8;
  local_68 = this;
  while( true ) {
    len = 0;
    ioctl(sock,0x541b,&len);
    if (len == 0) {
      return 0;
    }
    local_40 = (double)RTPTime::CurrentTime();
    iVar2 = (int)len;
    if (0x10000 < (int)len) {
      iVar2 = 0x10001;
    }
    complete = false;
    iVar2 = SocketData::ProcessAvailableBytes
                      (sdata,sock,iVar2,&complete,
                       (this->super_RTPTransmitter).super_RTPMemoryObject.mgr);
    if (iVar2 < 0) break;
    if (complete == true) {
      puVar1 = sdata->m_pDataBuffer;
      sdata->m_pDataBuffer = (uint8_t *)0x0;
      if (puVar1 != (uint8_t *)0x0) {
        iVar2 = sdata->m_dataLength;
        local_50[0] = 0;
        local_50[1] = 0;
        *(undefined8 *)(local_50 + 2) = 0;
        local_50[4] = 0;
        pRVar3 = (RTPAddress *)
                 operator_new(0x10,(this->super_RTPTransmitter).super_RTPMemoryObject.mgr,0x17);
        this = local_68;
        pRVar3->addresstype = TCPAddress;
        pRVar3->_vptr_RTPAddress = local_60;
        *(SocketType *)&pRVar3->field_0xc = sock;
        bVar4 = true;
        if (4 < (long)iVar2) {
          bVar4 = (byte)(puVar1[1] + 0x33) < 0xfb;
        }
        local_48 = (long)iVar2;
        pPack = (RTPRawPacket *)
                operator_new(0x38,(local_68->super_RTPTransmitter).super_RTPMemoryObject.mgr,0x1b);
        (pPack->super_RTPMemoryObject).mgr = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
        (pPack->super_RTPMemoryObject)._vptr_RTPMemoryObject =
             (_func_int **)&PTR__RTPRawPacket_00145050;
        (pPack->receivetime).m_t = local_40;
        pPack->packetdata = puVar1;
        pPack->packetdatalength = local_48;
        pPack->senderaddress = pRVar3;
        pPack->isrtp = bVar4;
        std::__cxx11::list<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>::
        push_back(local_58,&pPack);
      }
    }
  }
  return iVar2;
}

Assistant:

int RTPTCPTransmitter::PollSocket(SocketType sock, SocketData &sdata)
{
#ifdef RTP_SOCKETTYPE_WINSOCK
	unsigned long len;
#else 
	size_t len;
#endif // RTP_SOCKETTYPE_WINSOCK
	bool dataavailable;
	
	do
	{
		len = 0;
		RTPIOCTL(sock, FIONREAD, &len);

		if (len <= 0) 
			dataavailable = false;
		else
			dataavailable = true;
		
		if (dataavailable)
		{
			RTPTime curtime = RTPTime::CurrentTime();
			int relevantLen = RTPTCPTRANS_MAXPACKSIZE+2;
			
			if ((int)len < relevantLen)
				relevantLen = (int)len;

			bool complete = false;
			int status = sdata.ProcessAvailableBytes(sock, relevantLen, complete, GetMemoryManager());
			if (status < 0)
				return status;
			
			if (complete)
			{
				uint8_t *pBuf = sdata.ExtractDataBuffer();
				if (pBuf)
				{
					int dataLength = sdata.m_dataLength;
					sdata.Reset();

					RTPTCPAddress *pAddr = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPADDRESS) RTPTCPAddress(sock);
					if (pAddr == 0)
						return ERR_RTP_OUTOFMEM;

					bool isrtp = true;
					if (dataLength > (int)sizeof(RTCPCommonHeader))
					{
						RTCPCommonHeader *rtcpheader = (RTCPCommonHeader *)pBuf;
						uint8_t packettype = rtcpheader->packettype;

						if (packettype >= 200 && packettype <= 204)
							isrtp = false;
					}
						
					RTPRawPacket *pPack = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPRAWPACKET) RTPRawPacket(pBuf, dataLength, pAddr, curtime, isrtp, GetMemoryManager());
					if (pPack == 0)
					{
						RTPDelete(pAddr,GetMemoryManager());
						RTPDeleteByteArray(pBuf,GetMemoryManager());
						return ERR_RTP_OUTOFMEM;
					}
					m_rawpacketlist.push_back(pPack);	
				}
			}
		}
	} while (dataavailable);

	return 0;
}